

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CopyBuffer
          (DeviceContextVkImpl *this,IBuffer *pSrcBuffer,Uint64 SrcOffset,
          RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,IBuffer *pDstBuffer,
          Uint64 DstOffset,Uint64 Size,RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)

{
  BufferVkImpl *Buffer;
  BufferDesc *pBVar1;
  Char *pCVar2;
  char (*Args_1) [40];
  VkBuffer_T *pVVar3;
  size_t sVar4;
  VkBuffer srcBuffer;
  VkBuffer dstBuffer;
  undefined1 local_d0 [8];
  string msg_2;
  string msg_1;
  VkBufferCopy CopyRegion;
  undefined1 local_68 [8];
  string msg;
  BufferVkImpl *pDstBuffVk;
  BufferVkImpl *pSrcBuffVk;
  Uint64 DstOffset_local;
  IBuffer *pDstBuffer_local;
  RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode_local;
  Uint64 SrcOffset_local;
  IBuffer *pSrcBuffer_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcBuffer,SrcOffset,
             SrcBufferTransitionMode,pDstBuffer,DstOffset,Size,DstBufferTransitionMode);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pSrcBuffer);
  msg.field_2._8_8_ = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pDstBuffer);
  pBVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)msg.field_2._8_8_);
  if (pBVar1->Usage == USAGE_DYNAMIC) {
    FormatString<char[44]>
              ((string *)local_68,(char (*) [44])"Dynamic buffers cannot be copy destinations");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x85c);
    std::__cxx11::string::~string((string *)local_68);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,Buffer,SrcBufferTransitionMode,RESOURCE_STATE_COPY_SOURCE,
             VK_ACCESS_TRANSFER_READ_BIT,
             "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
  TransitionOrVerifyBufferState
            (this,(BufferVkImpl *)msg.field_2._8_8_,DstBufferTransitionMode,RESOURCE_STATE_COPY_DEST
             ,VK_ACCESS_TRANSFER_WRITE_BIT,
             "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");
  Args_1 = (char (*) [40])GetDynamicBufferOffset(this,Buffer,true);
  msg_1.field_2._8_8_ = *Args_1 + SrcOffset;
  pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)(msg.field_2._8_8_ + 0x98));
  if (pVVar3 == (VkBuffer_T *)0x0) {
    FormatString<char[49]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [49])"Copy destination buffer must not be suballocated");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [40])0x866;
    DebugAssertionFailed
              (pCVar2,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x866);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  sVar4 = GetDynamicBufferOffset(this,(BufferVkImpl *)msg.field_2._8_8_,true);
  if (sVar4 != 0) {
    FormatString<char[26],char[40]>
              ((string *)local_d0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetDynamicBufferOffset(pDstBuffVk) == 0",Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x867);
    std::__cxx11::string::~string((string *)local_d0);
  }
  srcBuffer = BufferVkImpl::GetVkBuffer(Buffer);
  dstBuffer = BufferVkImpl::GetVkBuffer((BufferVkImpl *)msg.field_2._8_8_);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,srcBuffer,dstBuffer,1,(VkBufferCopy *)((long)&msg_1.field_2 + 8)
            );
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::CopyBuffer(IBuffer*                       pSrcBuffer,
                                     Uint64                         SrcOffset,
                                     RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
                                     IBuffer*                       pDstBuffer,
                                     Uint64                         DstOffset,
                                     Uint64                         Size,
                                     RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)
{
    TDeviceContextBase::CopyBuffer(pSrcBuffer, SrcOffset, SrcBufferTransitionMode, pDstBuffer, DstOffset, Size, DstBufferTransitionMode);

    BufferVkImpl* pSrcBuffVk = ClassPtrCast<BufferVkImpl>(pSrcBuffer);
    BufferVkImpl* pDstBuffVk = ClassPtrCast<BufferVkImpl>(pDstBuffer);

    DEV_CHECK_ERR(pDstBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers cannot be copy destinations");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pSrcBuffVk, SrcBufferTransitionMode, RESOURCE_STATE_COPY_SOURCE, VK_ACCESS_TRANSFER_READ_BIT, "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
    TransitionOrVerifyBufferState(*pDstBuffVk, DstBufferTransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset + GetDynamicBufferOffset(pSrcBuffVk);
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = Size;
    VERIFY(pDstBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    VERIFY_EXPR(GetDynamicBufferOffset(pDstBuffVk) == 0);
    m_CommandBuffer.CopyBuffer(pSrcBuffVk->GetVkBuffer(), pDstBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}